

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::bind_by_name_no_component::test_method(bind_by_name_no_component *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  socklen_t in_ECX;
  no_component *e;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[24],_const_char_(&)[24]> local_1a0;
  assertion_result local_180;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  allocator<char> local_141;
  sockaddr local_140 [2];
  allocator<char> local_119;
  string local_118 [8];
  string invalid_name;
  context<0> c;
  provides<Inject::service> xxx;
  string local_78;
  component<Inject::impl1> local_58;
  component<Inject::impl1> xx;
  allocator<char> local_39;
  string local_38;
  component<Inject::service> local_18;
  component<Inject::service> x;
  bind_by_name_no_component *this_local;
  
  x._vptr_component = (_func_int **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"s",&local_39);
  inject::context<0>::component<Inject::service>::component(&local_18,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"impl1",(allocator<char> *)((long)&xxx._vptr_provides + 7));
  inject::context<0>::component<Inject::impl1>::component(&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&xxx._vptr_provides + 7));
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::context((context<0> *)((long)&invalid_name.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"this_is_not_a_component_name",&local_119);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_140,"impl1",&local_141);
  inject::context<0>::bind
            ((context<0> *)((long)&invalid_name.field_2 + 8),(int)local_118,local_140,in_ECX);
  std::__cxx11::string::~string((string *)local_140);
  std::allocator<char>::~allocator(&local_141);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x101,&local_168);
    boost::test_tools::assertion_result::assertion_result(&local_180,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1a0,prev,(char (*) [24])"no_component not thrown");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&e,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::test_tools::tt_detail::report_assertion(&local_180,&local_1a0,&e,0x101,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[24],_const_char_(&)[24]>::
    ~lazy_ostream_impl(&local_1a0);
    boost::test_tools::assertion_result::~assertion_result(&local_180);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string(local_118);
  inject::context<0>::~context((context<0> *)((long)&invalid_name.field_2 + 8));
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::component<Inject::impl1>::~component(&local_58);
  inject::context<0>::component<Inject::service>::~component(&local_18);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bind_by_name_no_component)
{
    context<>::component<service> x("s");
    context<>::component<impl1> xx("impl1");
    context<>::component<impl1>::provides<service> xxx;

    context<> c;

    const string invalid_name = "this_is_not_a_component_name";

    try {
        c.bind(invalid_name, "impl1");
        BOOST_ERROR("no_component not thrown");
    } catch (const no_component& e) {
        BOOST_CHECK(e.name() == invalid_name);
        BOOST_CHECK_EQUAL(e.id(), INVALID_ID);
    }
}